

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderNetworkIssueNotification(CHud *this)

{
  int Id;
  IClient *pIVar1;
  IGraphics *pIVar2;
  IGraphics *in_RDI;
  long in_FS_OFFSET;
  float fVar3;
  int in_stack_00000008;
  float in_stack_0000000c;
  float Margin;
  int NetScore;
  float FontSize;
  float x;
  CQuadItem QuadItem;
  vec4 Color;
  CUIRect RectBox;
  float Flags;
  float w;
  CQuadItem local_3c;
  uint local_2c;
  vector4_base<float> local_28;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CComponent::Graphics((CComponent *)0x163f1a);
  fVar3 = IGraphics::ScreenAspect(in_RDI);
  fVar3 = (fVar3 * 300.0) / 2.0 - 15.0;
  w = 10.0;
  pIVar1 = CComponent::Client((CComponent *)0x163f67);
  Id = (*(pIVar1->super_IInterface)._vptr_IInterface[0x12])();
  if (0xfa < Id) {
    Flags = 2.0;
    fVar3 = ((fVar3 - 5.0) - w) + -4.0;
    pIVar2 = CComponent::Graphics((CComponent *)0x163fd6);
    (*(pIVar2->super_IInterface)._vptr_IInterface[8])();
    local_14 = 4.0 - Flags;
    local_10 = Flags + Flags + w;
    local_c = Flags + Flags + w;
    local_18 = fVar3;
    vector4_base<float>::vector4_base(&local_28,0.0,0.0,0.0,0.3);
    CUIRect::Draw(_FontSize,_Margin,in_stack_0000000c,in_stack_00000008);
    pIVar2 = CComponent::Graphics((CComponent *)0x164074);
    local_2c = g_pData->m_aImages[0x15].m_Id.m_Id;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x13])(pIVar2,(ulong)local_2c);
    pIVar2 = CComponent::Graphics((CComponent *)0x1640a6);
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x17])();
    CComponent::RenderTools((CComponent *)0x1640bc);
    CRenderTools::SelectSprite
              ((CRenderTools *)CONCAT44(fVar3,w),Id,(int)Flags,(int)((ulong)in_RDI >> 0x20),
               (int)in_RDI);
    IGraphics::CQuadItem::CQuadItem(&local_3c,fVar3 + Flags,4.0,w,w);
    pIVar2 = CComponent::Graphics((CComponent *)0x164106);
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x1d])(pIVar2,&local_3c,1);
    pIVar2 = CComponent::Graphics((CComponent *)0x164126);
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x18])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderNetworkIssueNotification()
{
	float x = 300.0f*Graphics()->ScreenAspect()/2.0f - 15.0f;
	float FontSize = 10.0f;

	// render network indicator when 2/5 and under
	const int NetScore = Client()->GetInputtimeMarginStabilityScore();
	if(NetScore > 250)
	{
		float Margin = 2.0f;
		x = x-5.0f-FontSize-Margin*2;
		Graphics()->BlendNormal();
		CUIRect RectBox = {x, 4-Margin, FontSize+2*Margin, FontSize+2*Margin};
		vec4 Color = vec4(0.0f, 0.0f, 0.0f, 0.3f);
		RectBox.Draw(Color, 1.0f);
		Graphics()->TextureSet(g_pData->m_aImages[IMAGE_NETWORKICONS].m_Id);
		Graphics()->QuadsBegin();
		RenderTools()->SelectSprite(SPRITE_NETWORK_BAD);
		IGraphics::CQuadItem QuadItem(x+Margin, 4, FontSize, FontSize);
		Graphics()->QuadsDrawTL(&QuadItem, 1);
		Graphics()->QuadsEnd();
	}
}